

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O0

Image * Unit_Test::randomRGBImage(Image *reference)

{
  Image *in_RSI;
  Image *in_RDI;
  Image *image;
  uint8_t in_stack_ffffffffffffffee;
  uint8_t colorCount_;
  Image *this;
  
  colorCount_ = '\0';
  this = in_RDI;
  anon_unknown.dwarf_13e898::randomSize();
  anon_unknown.dwarf_13e898::randomSize();
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (this,(uint32_t)((ulong)in_RSI >> 0x20),(uint32_t)in_RSI,colorCount_,
             in_stack_ffffffffffffffee);
  anon_unknown.dwarf_13e898::fillRandomData(in_RSI);
  return in_RDI;
}

Assistant:

PenguinV_Image::Image randomRGBImage(const PenguinV_Image::Image & reference)
    {
        PenguinV_Image::Image image = reference.generate(randomSize(), randomSize(), PenguinV_Image::RGB);

        fillRandomData( image );

        return image;
    }